

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  uint uVar1;
  char *__s;
  HeapTypeKind HVar2;
  IString *this;
  undefined1 in_CL;
  uint uVar3;
  Literal *in_RDI;
  string_view sVar4;
  ulong in_stack_00000008;
  Type local_38;
  Type type;
  HeapType heapType;
  
  local_38.id = in_stack_00000008;
  switch(in_stack_00000008) {
  case 0:
  case 1:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
               ,0x81);
  case 2:
    (in_RDI->field_0).i32 = (int32_t)x.type;
    (in_RDI->type).id = 2;
    break;
  case 3:
    (in_RDI->field_0).i64 = x.type;
    (in_RDI->type).id = 3;
    break;
  case 4:
    type.id._0_4_ = (int32_t)x.type;
    wasm::Literal::castToF32(in_RDI,(Literal *)&type);
    goto LAB_00cec3cb;
  case 5:
    type.id = x.type;
    wasm::Literal::castToF64(in_RDI,(Literal *)&type);
LAB_00cec3cb:
    wasm::Literal::~Literal((Literal *)&type);
    break;
  case 6:
    wasm::Literal::Literal(in_RDI,(uint8_t *)&x);
    break;
  default:
    if ((in_stack_00000008 & 1) != 0) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x84,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    type.id = (uintptr_t)wasm::Type::getHeapType(&local_38);
    if (type.id < 0x7d) {
      uVar3 = (uint)type.id & 0x7b;
      uVar1 = uVar3 - 8 >> 3;
      uVar3 = uVar3 << 0x1d | uVar1;
      in_CL = (undefined1)uVar1;
      if (uVar3 - 10 < 5) {
        if ((6 < local_38.id) && (((uint)local_38.id & 3) == 2)) {
          wasm::Literal::makeNull(in_RDI,(HeapType)type.id);
          return in_RDI;
        }
        __assert_fail("type.isNullable()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                      ,0x9b,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
      switch(uVar3) {
      case 0:
      case 3:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x8c);
      case 1:
      case 2:
      case 4:
      case 6:
      case 7:
      case 8:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x93);
      case 5:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x89);
      case 9:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x95);
      }
    }
    HVar2 = wasm::HeapType::getKind((HeapType *)&type);
    if (HVar2 != Func) {
      HVar2 = wasm::HeapType::getKind((HeapType *)&type);
      if (((HVar2 & ~Func) != Struct) && (0x7c < type.id || ((uint)type.id & 0x7b) != 0x50)) {
        __assert_fail("heapType.isData()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                      ,0xa2,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0xa3);
    }
    __s = (char *)CONCAT44(x.type._4_4_,(int32_t)x.type);
    this = (IString *)strlen(__s);
    sVar4._M_str = (char *)0x0;
    sVar4._M_len = (size_t)__s;
    sVar4 = wasm::IString::interned(this,sVar4,(bool)in_CL);
    wasm::Literal::Literal(in_RDI,(Name)sVar4,(HeapType)type.id);
  }
  return in_RDI;
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}